

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::AddLocationAndComponentDecorations
          (InterfaceVariableScalarReplacement *this,NestedCompositeComponents *vars,
          uint32_t *location,uint32_t component)

{
  pointer pNVar1;
  Instruction *this_00;
  IRContext *pIVar2;
  uint32_t var_id;
  const_iterator __begin2;
  pointer vars_00;
  
  vars_00 = (vars->nested_composite_components).
            super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (vars->nested_composite_components).
           super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (vars_00 == pNVar1) {
    this_00 = vars->component_variable;
    var_id = 0;
    if (this_00->has_result_id_ == true) {
      var_id = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
    }
    pIVar2 = (this->super_Pass).context_;
    if ((pIVar2->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(pIVar2);
    }
    anon_unknown_0::CreateDecoration
              ((pIVar2->decoration_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
               _M_head_impl,var_id,DecorationLocation,*location);
    pIVar2 = (this->super_Pass).context_;
    if ((pIVar2->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(pIVar2);
    }
    anon_unknown_0::CreateDecoration
              ((pIVar2->decoration_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
               _M_head_impl,var_id,Component,component);
    *location = *location + 1;
  }
  else {
    do {
      AddLocationAndComponentDecorations(this,vars_00,location,component);
      vars_00 = vars_00 + 1;
    } while (vars_00 != pNVar1);
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::AddLocationAndComponentDecorations(
    const NestedCompositeComponents& vars, uint32_t* location,
    uint32_t component) {
  if (!vars.HasMultipleComponents()) {
    uint32_t var_id = vars.GetComponentVariable()->result_id();
    CreateDecoration(context()->get_decoration_mgr(), var_id,
                     spv::Decoration::Location, *location);
    CreateDecoration(context()->get_decoration_mgr(), var_id,
                     spv::Decoration::Component, component);
    ++(*location);
    return;
  }
  for (const auto& var : vars.GetComponents()) {
    AddLocationAndComponentDecorations(var, location, component);
  }
}